

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O1

void resobj_clear(CUPDLPresobj *resobj)

{
  if (resobj != (CUPDLPresobj *)0x0) {
    if (resobj->primalResidual != (cupdlp_float *)0x0) {
      free(resobj->primalResidual);
      resobj->primalResidual = (cupdlp_float *)0x0;
    }
    if (resobj->dualResidual != (cupdlp_float *)0x0) {
      free(resobj->dualResidual);
      resobj->dualResidual = (cupdlp_float *)0x0;
    }
    if (resobj->primalResidualAverage != (cupdlp_float *)0x0) {
      free(resobj->primalResidualAverage);
      resobj->primalResidualAverage = (cupdlp_float *)0x0;
    }
    if (resobj->dualResidualAverage != (cupdlp_float *)0x0) {
      free(resobj->dualResidualAverage);
      resobj->dualResidualAverage = (cupdlp_float *)0x0;
    }
    if (resobj->dSlackPos != (cupdlp_float *)0x0) {
      free(resobj->dSlackPos);
      resobj->dSlackPos = (cupdlp_float *)0x0;
    }
    if (resobj->dSlackNeg != (cupdlp_float *)0x0) {
      free(resobj->dSlackNeg);
      resobj->dSlackNeg = (cupdlp_float *)0x0;
    }
    if (resobj->dSlackPosAverage != (cupdlp_float *)0x0) {
      free(resobj->dSlackPosAverage);
      resobj->dSlackPosAverage = (cupdlp_float *)0x0;
    }
    if (resobj->dSlackNegAverage != (cupdlp_float *)0x0) {
      free(resobj->dSlackNegAverage);
      resobj->dSlackNegAverage = (cupdlp_float *)0x0;
    }
    if (resobj->dLowerFiltered != (cupdlp_float *)0x0) {
      free(resobj->dLowerFiltered);
      resobj->dLowerFiltered = (cupdlp_float *)0x0;
    }
    if (resobj->dUpperFiltered != (cupdlp_float *)0x0) {
      free(resobj->dUpperFiltered);
      resobj->dUpperFiltered = (cupdlp_float *)0x0;
    }
    if (resobj->primalInfeasRay != (cupdlp_float *)0x0) {
      free(resobj->primalInfeasRay);
      resobj->primalInfeasRay = (cupdlp_float *)0x0;
    }
    if (resobj->primalInfeasConstr != (cupdlp_float *)0x0) {
      free(resobj->primalInfeasConstr);
      resobj->primalInfeasConstr = (cupdlp_float *)0x0;
    }
    if (resobj->primalInfeasBound != (cupdlp_float *)0x0) {
      free(resobj->primalInfeasBound);
      resobj->primalInfeasBound = (cupdlp_float *)0x0;
    }
    if (resobj->dualInfeasRay != (cupdlp_float *)0x0) {
      free(resobj->dualInfeasRay);
      resobj->dualInfeasRay = (cupdlp_float *)0x0;
    }
    if (resobj->dualInfeasLbRay != (cupdlp_float *)0x0) {
      free(resobj->dualInfeasLbRay);
      resobj->dualInfeasLbRay = (cupdlp_float *)0x0;
    }
    if (resobj->dualInfeasUbRay != (cupdlp_float *)0x0) {
      free(resobj->dualInfeasUbRay);
      resobj->dualInfeasUbRay = (cupdlp_float *)0x0;
    }
    if (resobj->dualInfeasConstr != (cupdlp_float *)0x0) {
      free(resobj->dualInfeasConstr);
      resobj->dualInfeasConstr = (cupdlp_float *)0x0;
    }
    free(resobj);
    return;
  }
  return;
}

Assistant:

void resobj_clear(CUPDLPresobj *resobj) {
  if (resobj) {
    if (resobj->primalResidual) {
      CUPDLP_FREE_VEC(resobj->primalResidual);
    }
    if (resobj->dualResidual) {
      CUPDLP_FREE_VEC(resobj->dualResidual);
    }
    if (resobj->primalResidualAverage) {
      CUPDLP_FREE_VEC(resobj->primalResidualAverage);
    }
    if (resobj->dualResidualAverage) {
      CUPDLP_FREE_VEC(resobj->dualResidualAverage);
    }
    if (resobj->dSlackPos) {
      CUPDLP_FREE_VEC(resobj->dSlackPos);
    }
    if (resobj->dSlackNeg) {
      CUPDLP_FREE_VEC(resobj->dSlackNeg);
    }
    if (resobj->dSlackPosAverage) {
      CUPDLP_FREE_VEC(resobj->dSlackPosAverage);
    }
    if (resobj->dSlackNegAverage) {
      CUPDLP_FREE_VEC(resobj->dSlackNegAverage);
    }
    if (resobj->dLowerFiltered) {
      CUPDLP_FREE_VEC(resobj->dLowerFiltered);
    }
    if (resobj->dUpperFiltered) {
      CUPDLP_FREE_VEC(resobj->dUpperFiltered);
    }
    if (resobj->primalInfeasRay) {
      CUPDLP_FREE_VEC(resobj->primalInfeasRay);
    }
    if (resobj->primalInfeasConstr) {
      CUPDLP_FREE_VEC(resobj->primalInfeasConstr);
    }
    if (resobj->primalInfeasBound) {
      CUPDLP_FREE_VEC(resobj->primalInfeasBound);
    }
    if (resobj->dualInfeasRay) {
      CUPDLP_FREE_VEC(resobj->dualInfeasRay);
    }
    if (resobj->dualInfeasLbRay) {
      CUPDLP_FREE_VEC(resobj->dualInfeasLbRay);
    }
    if (resobj->dualInfeasUbRay) {
      CUPDLP_FREE_VEC(resobj->dualInfeasUbRay);
    }
    if (resobj->dualInfeasConstr) {
      CUPDLP_FREE_VEC(resobj->dualInfeasConstr);
    }
    // if (resobj->dualInfeasBound) {
    //   CUPDLP_FREE_VEC(resobj->dualInfeasBound);
    // }
    cupdlp_free(resobj);
  }
}